

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gate.c
# Opt level: O3

int mixed_make_segment_gate(uint32_t samplerate,mixed_segment *segment)

{
  void *pvVar1;
  
  pvVar1 = (*mixed_calloc)(1,0x30);
  if (pvVar1 == (void *)0x0) {
    mixed_err(1);
  }
  else {
    *(uint32_t *)((long)pvVar1 + 0x24) = samplerate;
    *(undefined8 *)((long)pvVar1 + 0x10) = 0x3d8138563ccdc614;
    *(undefined8 *)((long)pvVar1 + 0x18) = 0x3e4ccccd3ccccccd;
    *(undefined4 *)((long)pvVar1 + 0x20) = 0x3e19999a;
    *(undefined4 *)((long)pvVar1 + 0x2c) = 1;
    segment->free = gate_segment_free;
    segment->start = gate_segment_start;
    segment->mix = (_func_int_mixed_segment_ptr *)&LAB_001056c0;
    segment->set_in = gate_segment_set_in;
    segment->set_out = gate_segment_set_out;
    segment->info = gate_segment_info;
    segment->get = gate_segment_get;
    segment->set = gate_segment_set;
    segment->data = pvVar1;
  }
  return (uint)(pvVar1 != (void *)0x0);
}

Assistant:

MIXED_EXPORT int mixed_make_segment_gate(uint32_t samplerate, struct mixed_segment *segment){
  struct gate_segment_data *data = mixed_calloc(1, sizeof(struct gate_segment_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  data->samplerate = samplerate;
  data->open_threshold = db_to_linear(-24.0);
  data->close_threshold = db_to_linear(-32.0);
  data->attack = 0.025;
  data->hold = 0.2;
  data->release = 0.15;
  data->state = CLOSED;
  
  segment->free = gate_segment_free;
  segment->start = gate_segment_start;
  segment->mix = gate_segment_mix;
  segment->set_in = gate_segment_set_in;
  segment->set_out = gate_segment_set_out;
  segment->info = gate_segment_info;
  segment->get = gate_segment_get;
  segment->set = gate_segment_set;
  segment->data = data;
  return 1;
}